

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

int __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::set_layer_pattern
          (DatarateTestSVC *this,int frame_cnt,aom_svc_layer_id_t *layer_id,
          aom_svc_ref_frame_config_t *ref_frame_config,
          aom_svc_ref_frame_comp_pred_t *ref_frame_comp_pred,int spatial_layer,int multi_ref,
          int comp_pred,int is_key_frame,int dynamic_enable_disable_mode,int rps_mode,
          int rps_recovery_frame,int simulcast_mode,bool use_last_as_scaled,
          bool use_last_as_scaled_single_ref)

{
  int iVar1;
  int iVar2;
  aom_svc_ref_frame_config_t *in_RCX;
  aom_svc_layer_id_t *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int layer_flags;
  int i_1;
  int i;
  int base_count;
  int lag_index;
  byte in_stack_00000048;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_40;
  int local_3c;
  int local_34;
  
  local_34 = 0;
  iVar1 = in_ESI >> 2;
  in_RDX->spatial_layer_id = in_R9D;
  for (local_3c = 0; local_3c < 7; local_3c = local_3c + 1) {
    in_RCX->ref_idx[local_3c] = local_3c;
    in_RCX->reference[local_3c] = 0;
  }
  for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
    in_RCX->refresh[local_40] = 0;
  }
  if (in_stack_00000010 != 0) {
    *in_R8 = 1;
    in_R8[1] = 1;
    in_R8[2] = 1;
  }
  in_RCX->reference[0] = 1;
  if ((*(int *)(in_RDI + 0x4f0) == 1) && (*(int *)(in_RDI + 0x4f4) == 1)) {
    in_RDX->temporal_layer_id = 0;
    in_RCX->refresh[0] = 1;
    if (i_4 != 0) {
      ref_config_rps(in_RCX,in_ESI,i_2);
    }
    if (*(int *)(in_RDI + 0x1880) != 0) {
      in_RCX->ref_idx[0] = 0;
      in_RCX->ref_idx[3] = 1;
      in_RCX->ref_idx[6] = 2;
      if (in_ESI == 1) {
        for (local_48 = 0; local_48 < 7; local_48 = local_48 + 1) {
          in_RCX->reference[local_48] = 0;
        }
      }
    }
  }
  if ((*(int *)(in_RDI + 0x4f0) == 2) && (*(int *)(in_RDI + 0x4f4) == 1)) {
    iVar1 = in_ESI >> 1;
    in_RCX->ref_idx[3] = 3;
    local_34 = 5;
    if (0 < iVar1) {
      iVar2 = iVar1;
      if (in_ESI % 2 != 0) {
        iVar2 = iVar1 + 1;
      }
      local_34 = iVar2 % 3 + 5;
    }
    in_RCX->ref_idx[6] = local_34;
    if (in_ESI % 2 == 0) {
      in_RDX->temporal_layer_id = 0;
      in_RCX->refresh[0] = 1;
      in_RCX->reference[0] = 1;
      in_RCX->refresh[local_34] = 1;
      if (iVar1 % 0x20 == 0) {
        in_RCX->refresh[3] = 1;
      }
    }
    else {
      in_RDX->temporal_layer_id = 1;
      in_RCX->reference[0] = 1;
    }
    if (in_RDX->temporal_layer_id == 0) {
      in_RCX->reference[3] = 1;
      in_RCX->reference[6] = 1;
    }
  }
  else if ((*(int *)(in_RDI + 0x4f0) == 3) && (*(int *)(in_RDI + 0x4f4) == 1)) {
    if (in_stack_00000008 != 0) {
      in_RCX->ref_idx[3] = 3;
      local_34 = iVar1 % 4 + 4;
      in_RCX->ref_idx[6] = local_34;
    }
    if (in_ESI % 4 == 0) {
      in_RDX->temporal_layer_id = 0;
      in_RCX->refresh[0] = 1;
      in_RCX->reference[3] = 1;
      if (in_stack_00000008 != 0) {
        if (iVar1 % 10 == 0) {
          in_RCX->refresh[3] = 1;
        }
        in_RCX->refresh[local_34] = 1;
      }
    }
    else if ((in_ESI + -1) % 4 == 0) {
      in_RDX->temporal_layer_id = 2;
    }
    else if ((in_ESI + -2) % 4 == 0) {
      in_RDX->temporal_layer_id = 1;
      in_RCX->refresh[1] = 1;
    }
    else if ((in_ESI + -3) % 4 == 0) {
      in_RDX->temporal_layer_id = 2;
      in_RCX->ref_idx[0] = 1;
      in_RCX->ref_idx[1] = 0;
    }
    if (in_stack_00000008 != 0) {
      in_RCX->reference[3] = 1;
      in_RCX->reference[6] = 1;
    }
  }
  else if ((*(int *)(in_RDI + 0x4f0) == 1) && (*(int *)(in_RDI + 0x4f4) == 2)) {
    in_RDX->temporal_layer_id = 0;
    if (in_RDX->spatial_layer_id == 0) {
      in_RCX->ref_idx[0] = 0;
      in_RCX->ref_idx[3] = 3;
      in_RCX->refresh[0] = 1;
    }
    else if (in_RDX->spatial_layer_id == 1) {
      in_RCX->ref_idx[0] = 3;
      in_RCX->ref_idx[3] = 0;
      in_RCX->refresh[3] = 1;
    }
    if (0 < in_RDX->spatial_layer_id) {
      in_RCX->reference[3] = 1;
    }
  }
  else if ((*(int *)(in_RDI + 0x4f0) == 1) && (*(int *)(in_RDI + 0x4f4) == 3)) {
    in_RDX->temporal_layer_id = 0;
    if (in_RDX->spatial_layer_id == 0) {
      for (local_4c = 0; local_4c < 7; local_4c = local_4c + 1) {
        in_RCX->ref_idx[local_4c] = 0;
      }
      in_RCX->refresh[0] = 1;
    }
    else if (in_RDX->spatial_layer_id == 1) {
      for (local_50 = 0; local_50 < 7; local_50 = local_50 + 1) {
        in_RCX->ref_idx[local_50] = 0;
      }
      in_RCX->ref_idx[0] = 1;
      if (((byte)base_count & 1) != 0) {
        for (local_54 = 0; local_54 < 7; local_54 = local_54 + 1) {
          in_RCX->ref_idx[local_54] = 1;
        }
        in_RCX->ref_idx[0] = 0;
        in_RCX->ref_idx[3] = 1;
      }
      in_RCX->refresh[1] = 1;
    }
    else if (in_RDX->spatial_layer_id == 2) {
      for (local_58 = 0; local_58 < 7; local_58 = local_58 + 1) {
        in_RCX->ref_idx[local_58] = 1;
      }
      in_RCX->ref_idx[0] = 2;
      in_RCX->refresh[2] = 1;
      if (in_stack_00000008 != 0) {
        in_RCX->ref_idx[6] = 7;
        in_RCX->reference[6] = 1;
        if (iVar1 % 10 == 0) {
          in_RCX->refresh[7] = 1;
        }
      }
    }
    if (0 < in_RDX->spatial_layer_id) {
      if ((in_stack_00000048 & 1) == 0) {
        in_RCX->reference[3] = 1;
      }
      else {
        in_RCX->reference[3] = 0;
      }
    }
  }
  else if ((*(int *)(in_RDI + 0x4f0) == 3) && (*(int *)(in_RDI + 0x4f4) == 3)) {
    if (i_1 == 0) {
      ref_config_3SL3TL(in_RCX,in_RDX,in_stack_00000018,*(int *)(in_RDI + 0x4ec));
      if ((in_stack_00000008 != 0) && (in_RDX->spatial_layer_id == 2)) {
        in_RCX->ref_idx[6] = 7;
        if (in_stack_00000018 == 0) {
          in_RCX->reference[6] = 1;
        }
        if ((iVar1 % 10 == 0) && (in_RDX->temporal_layer_id == 0)) {
          in_RCX->refresh[7] = 1;
        }
      }
    }
    else {
      ref_config_simulcast3SL3TL(in_RCX,in_RDX,in_stack_00000018,*(int *)(in_RDI + 0x4ec));
    }
  }
  if ((i_6 == 1) && (in_RDX->spatial_layer_id == *(int *)(in_RDI + 0x4f4) + -1)) {
    in_RCX->reference[0] = 0;
  }
  return 0;
}

Assistant:

virtual int set_layer_pattern(
      int frame_cnt, aom_svc_layer_id_t *layer_id,
      aom_svc_ref_frame_config_t *ref_frame_config,
      aom_svc_ref_frame_comp_pred_t *ref_frame_comp_pred, int spatial_layer,
      int multi_ref, int comp_pred, int is_key_frame,
      int dynamic_enable_disable_mode, int rps_mode, int rps_recovery_frame,
      int simulcast_mode, bool use_last_as_scaled,
      bool use_last_as_scaled_single_ref) {
    int lag_index = 0;
    int base_count = frame_cnt >> 2;
    layer_id->spatial_layer_id = spatial_layer;
    // Set the reference map buffer idx for the 7 references:
    // LAST_FRAME (0), LAST2_FRAME(1), LAST3_FRAME(2), GOLDEN_FRAME(3),
    // BWDREF_FRAME(4), ALTREF2_FRAME(5), ALTREF_FRAME(6).
    for (int i = 0; i < INTER_REFS_PER_FRAME; i++) {
      ref_frame_config->ref_idx[i] = i;
      ref_frame_config->reference[i] = 0;
    }
    for (int i = 0; i < REF_FRAMES; i++) ref_frame_config->refresh[i] = 0;
    if (comp_pred) {
      ref_frame_comp_pred->use_comp_pred[0] = 1;  // GOLDEN_LAST
      ref_frame_comp_pred->use_comp_pred[1] = 1;  // LAST2_LAST
      ref_frame_comp_pred->use_comp_pred[2] = 1;  // ALTREF_LAST
    }
    // Set layer_flags to 0 when using ref_frame_config->reference.
    int layer_flags = 0;
    // Always reference LAST.
    ref_frame_config->reference[0] = 1;
    if (number_temporal_layers_ == 1 && number_spatial_layers_ == 1) {
      layer_id->temporal_layer_id = 0;
      ref_frame_config->refresh[0] = 1;
      if (rps_mode)
        ref_config_rps(ref_frame_config, frame_cnt, rps_recovery_frame);
      if (intra_only_single_layer_) {
        // This repros the crash in Bug: 363016123.
        ref_frame_config->ref_idx[0] = 0;
        ref_frame_config->ref_idx[3] = 1;
        ref_frame_config->ref_idx[6] = 2;
        if (frame_cnt == 1) {
          for (int i = 0; i < INTER_REFS_PER_FRAME; i++)
            ref_frame_config->reference[i] = 0;
        }
      }
    }
    if (number_temporal_layers_ == 2 && number_spatial_layers_ == 1) {
      // 2-temporal layer.
      //    1    3    5
      //  0    2    4
      // Keep golden fixed at slot 3.
      base_count = frame_cnt >> 1;
      ref_frame_config->ref_idx[3] = 3;
      // Cyclically refresh slots 5, 6, 7, for lag alt ref.
      lag_index = 5;
      if (base_count > 0) {
        lag_index = 5 + (base_count % 3);
        if (frame_cnt % 2 != 0) lag_index = 5 + ((base_count + 1) % 3);
      }
      // Set the altref slot to lag_index.
      ref_frame_config->ref_idx[6] = lag_index;
      if (frame_cnt % 2 == 0) {
        layer_id->temporal_layer_id = 0;
        // Update LAST on layer 0, reference LAST.
        ref_frame_config->refresh[0] = 1;
        ref_frame_config->reference[0] = 1;
        // Refresh lag_index slot, needed for lagging golen.
        ref_frame_config->refresh[lag_index] = 1;
        // Refresh GOLDEN every x base layer frames.
        if (base_count % 32 == 0) ref_frame_config->refresh[3] = 1;
      } else {
        layer_id->temporal_layer_id = 1;
        // No updates on layer 1, reference LAST (TL0).
        ref_frame_config->reference[0] = 1;
      }
      // Always reference golden and altref on TL0.
      if (layer_id->temporal_layer_id == 0) {
        ref_frame_config->reference[3] = 1;
        ref_frame_config->reference[6] = 1;
      }
    } else if (number_temporal_layers_ == 3 && number_spatial_layers_ == 1) {
      // 3-layer:
      //   1    3   5    7
      //     2        6
      // 0        4        8
      if (multi_ref) {
        // Keep golden fixed at slot 3.
        ref_frame_config->ref_idx[3] = 3;
        // Cyclically refresh slots 4, 5, 6, 7, for lag altref.
        lag_index = 4 + (base_count % 4);
        // Set the altref slot to lag_index.
        ref_frame_config->ref_idx[6] = lag_index;
      }
      if (frame_cnt % 4 == 0) {
        // Base layer.
        layer_id->temporal_layer_id = 0;
        // Update LAST on layer 0, reference LAST and GF.
        ref_frame_config->refresh[0] = 1;
        ref_frame_config->reference[3] = 1;
        if (multi_ref) {
          // Refresh GOLDEN every x ~10 base layer frames.
          if (base_count % 10 == 0) ref_frame_config->refresh[3] = 1;
          // Refresh lag_index slot, needed for lagging altref.
          ref_frame_config->refresh[lag_index] = 1;
        }
      } else if ((frame_cnt - 1) % 4 == 0) {
        layer_id->temporal_layer_id = 2;
        // First top layer: no updates, only reference LAST (TL0).
      } else if ((frame_cnt - 2) % 4 == 0) {
        layer_id->temporal_layer_id = 1;
        // Middle layer (TL1): update LAST2, only reference LAST (TL0).
        ref_frame_config->refresh[1] = 1;
      } else if ((frame_cnt - 3) % 4 == 0) {
        layer_id->temporal_layer_id = 2;
        // Second top layer: no updates, only reference LAST.
        // Set buffer idx for LAST to slot 1, since that was the slot
        // updated in previous frame. So LAST is TL1 frame.
        ref_frame_config->ref_idx[0] = 1;
        ref_frame_config->ref_idx[1] = 0;
      }
      if (multi_ref) {
        // Every frame can reference GOLDEN AND ALTREF.
        ref_frame_config->reference[3] = 1;
        ref_frame_config->reference[6] = 1;
      }
    } else if (number_temporal_layers_ == 1 && number_spatial_layers_ == 2) {
      layer_id->temporal_layer_id = 0;
      if (layer_id->spatial_layer_id == 0) {
        // Reference LAST, update LAST. Keep LAST and GOLDEN in slots 0 and 3.
        ref_frame_config->ref_idx[0] = 0;
        ref_frame_config->ref_idx[3] = 3;
        ref_frame_config->refresh[0] = 1;
      } else if (layer_id->spatial_layer_id == 1) {
        // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 3
        // and GOLDEN to slot 0. Update slot 3 (LAST).
        ref_frame_config->ref_idx[0] = 3;
        ref_frame_config->ref_idx[3] = 0;
        ref_frame_config->refresh[3] = 1;
      }
      // Reference GOLDEN.
      if (layer_id->spatial_layer_id > 0) ref_frame_config->reference[3] = 1;
    } else if (number_temporal_layers_ == 1 && number_spatial_layers_ == 3) {
      // 3 spatial layers, 1 temporal.
      // Note for this case , we set the buffer idx for all references to be
      // either LAST or GOLDEN, which are always valid references, since decoder
      // will check if any of the 7 references is valid scale in
      // valid_ref_frame_size().
      layer_id->temporal_layer_id = 0;
      if (layer_id->spatial_layer_id == 0) {
        // Reference LAST, update LAST. Set all other buffer_idx to 0.
        for (int i = 0; i < 7; i++) ref_frame_config->ref_idx[i] = 0;
        ref_frame_config->refresh[0] = 1;
      } else if (layer_id->spatial_layer_id == 1) {
        // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 1
        // and GOLDEN (and all other refs) to slot 0.
        // Update slot 1 (LAST).
        for (int i = 0; i < 7; i++) ref_frame_config->ref_idx[i] = 0;
        ref_frame_config->ref_idx[0] = 1;
        if (use_last_as_scaled) {
          for (int i = 0; i < 7; i++) ref_frame_config->ref_idx[i] = 1;
          ref_frame_config->ref_idx[0] = 0;
          ref_frame_config->ref_idx[3] = 1;
        }
        ref_frame_config->refresh[1] = 1;
      } else if (layer_id->spatial_layer_id == 2) {
        // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 2
        // and GOLDEN (and all other refs) to slot 1.
        // Update slot 2 (LAST).
        for (int i = 0; i < 7; i++) ref_frame_config->ref_idx[i] = 1;
        ref_frame_config->ref_idx[0] = 2;
        ref_frame_config->refresh[2] = 1;
        if (multi_ref) {
          ref_frame_config->ref_idx[6] = 7;
          ref_frame_config->reference[6] = 1;
          if (base_count % 10 == 0) ref_frame_config->refresh[7] = 1;
        }
      }
      // Reference GOLDEN.
      if (layer_id->spatial_layer_id > 0) {
        if (use_last_as_scaled_single_ref)
          ref_frame_config->reference[3] = 0;
        else
          ref_frame_config->reference[3] = 1;
      }
    } else if (number_temporal_layers_ == 3 && number_spatial_layers_ == 3) {
      if (simulcast_mode) {
        ref_config_simulcast3SL3TL(ref_frame_config, layer_id, is_key_frame,
                                   superframe_cnt_);
      } else {
        ref_config_3SL3TL(ref_frame_config, layer_id, is_key_frame,
                          superframe_cnt_);
        // Allow for top spatial layer to use additional temporal reference.
        // Additional reference is only updated on base temporal layer, every
        // 10 TL0 frames here.
        if (multi_ref && layer_id->spatial_layer_id == 2) {
          ref_frame_config->ref_idx[6] = 7;
          if (!is_key_frame) ref_frame_config->reference[6] = 1;
          if (base_count % 10 == 0 && layer_id->temporal_layer_id == 0)
            ref_frame_config->refresh[7] = 1;
        }
      }
    }
    // If the top spatial layer is first-time encoded in mid-sequence
    // (i.e., dynamic_enable_disable_mode = 1), then don't predict from LAST,
    // since it will have been last updated on first key frame (SL0) and so
    // be different resolution from SL2.
    if (dynamic_enable_disable_mode == 1 &&
        layer_id->spatial_layer_id == number_spatial_layers_ - 1)
      ref_frame_config->reference[0] = 0;
    return layer_flags;
  }